

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperOffset::DoSquare(ClipperOffset *this,int j,int k)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  reference pvVar5;
  reference pvVar6;
  cInt cVar7;
  cInt cVar8;
  double dVar9;
  IntPoint local_40;
  IntPoint local_30;
  double local_20;
  double dx;
  int k_local;
  int j_local;
  ClipperOffset *this_local;
  
  dVar9 = this->m_sinA;
  dx._0_4_ = k;
  dx._4_4_ = j;
  _k_local = this;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)k);
  dVar1 = pvVar5->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._4_4_);
  dVar2 = pvVar5->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._0_4_);
  dVar3 = pvVar5->Y;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._4_4_);
  dVar9 = atan2(dVar9,dVar1 * dVar2 + dVar3 * pvVar5->Y);
  local_20 = tan(dVar9 / 4.0);
  pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (&this->m_srcPoly,(long)dx._4_4_);
  lVar4 = pvVar6->X;
  dVar9 = this->m_delta;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._0_4_);
  dVar1 = pvVar5->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._0_4_);
  cVar7 = Round(dVar9 * (-pvVar5->Y * local_20 + dVar1) + (double)lVar4);
  pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (&this->m_srcPoly,(long)dx._4_4_);
  lVar4 = pvVar6->Y;
  dVar9 = this->m_delta;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._0_4_);
  dVar1 = pvVar5->Y;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._0_4_);
  cVar8 = Round(dVar9 * (pvVar5->X * local_20 + dVar1) + (double)lVar4);
  IntPoint::IntPoint(&local_30,cVar7,cVar8);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
            (&this->m_destPoly,&local_30);
  pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (&this->m_srcPoly,(long)dx._4_4_);
  lVar4 = pvVar6->X;
  dVar9 = this->m_delta;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._4_4_);
  dVar1 = pvVar5->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._4_4_);
  cVar7 = Round(dVar9 * (pvVar5->Y * local_20 + dVar1) + (double)lVar4);
  pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (&this->m_srcPoly,(long)dx._4_4_);
  lVar4 = pvVar6->Y;
  dVar9 = this->m_delta;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._4_4_);
  dVar1 = pvVar5->Y;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)dx._4_4_);
  cVar8 = Round(dVar9 * (-pvVar5->X * local_20 + dVar1) + (double)lVar4);
  IntPoint::IntPoint(&local_40,cVar7,cVar8);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
            (&this->m_destPoly,&local_40);
  return;
}

Assistant:

void ClipperOffset::DoSquare(int j, int k)
{
  double dx = std::tan(std::atan2(m_sinA,
      m_normals[k].X * m_normals[j].X + m_normals[k].Y * m_normals[j].Y) / 4);
  m_destPoly.push_back(IntPoint(
      Round(m_srcPoly[j].X + m_delta * (m_normals[k].X - m_normals[k].Y * dx)),
      Round(m_srcPoly[j].Y + m_delta * (m_normals[k].Y + m_normals[k].X * dx))));
  m_destPoly.push_back(IntPoint(
      Round(m_srcPoly[j].X + m_delta * (m_normals[j].X + m_normals[j].Y * dx)),
      Round(m_srcPoly[j].Y + m_delta * (m_normals[j].Y - m_normals[j].X * dx))));
}